

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

void __thiscall CoreML::Model::Model(Model *this,Model *proto)

{
  undefined1 local_28 [24];
  Model *proto_local;
  Model *this_local;
  
  this->_vptr_Model = (_func_int **)&PTR__Model_00576140;
  local_28._16_8_ = proto;
  proto_local = (Model *)this;
  std::shared_ptr<CoreML::Specification::Model>::shared_ptr(&this->m_spec);
  std::make_shared<CoreML::Specification::Model,CoreML::Specification::Model_const&>
            ((Model *)local_28);
  std::shared_ptr<CoreML::Specification::Model>::operator=
            (&this->m_spec,(shared_ptr<CoreML::Specification::Model> *)local_28);
  std::shared_ptr<CoreML::Specification::Model>::~shared_ptr
            ((shared_ptr<CoreML::Specification::Model> *)local_28);
  downgradeSpecificationVersion(this);
  return;
}

Assistant:

Model::Model(const Specification::Model& proto) {
        m_spec = std::make_shared<Specification::Model>(proto);
        // We need to check this here because the proto could be overly strict
        downgradeSpecificationVersion();
    }